

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O3

void __thiscall ExtendedKalmanFilter_init_Test::TestBody(ExtendedKalmanFilter_init_Test *this)

{
  bool bVar1;
  char *in_R9;
  ExtendedKalmanFilter<Kalman::Vector<float,_3>_> ekf;
  ExtendedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ekfMatrix;
  AssertionResult gtest_ar_;
  AssertHelper local_30;
  Message local_28;
  AssertionResult gtest_ar__1;
  
  ekf.super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 1.0;
  ekf.super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1e-05;
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                    ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     ((long)&ekf.super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.
                             super_Matrix<float,_3,_1>.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data + 4),
                     (float *)((long)&ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                      super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data + 0x1c));
  ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (float)CONCAT31(ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                       array[7]._1_3_,bVar1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ekfMatrix.super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 1.0;
    ekfMatrix.super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1e-05;
    local_28.ss_.ptr_._0_1_ =
         (internal)
         Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                   ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                    ((long)ekfMatrix.super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
                           super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + 4),
                    (float *)((long)&ekfMatrix.
                                     super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                     super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data + 0x1c));
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if (!(bool)local_28.ss_.ptr_._0_1_) {
      testing::Message::Message((Message *)&gtest_ar__1.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 ((long)&ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data + 0x1c),(internal *)&local_28,
                 (AssertionResult *)"ekfMatrix.P.isIdentity()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/ExtendedKalmanFilter.cpp"
                 ,0x12,(char *)CONCAT44(ekfMatrix.
                                        super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                        .super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                        m_storage.m_data.array[8],
                                        ekfMatrix.
                                        super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                        .super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                        m_storage.m_data.array[7]));
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar__1.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[8],ekfMatrix.
                               super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data.array[7]) != &gtest_ar_.message_) {
        operator_delete((undefined1 *)
                        CONCAT44(ekfMatrix.
                                 super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                 super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[8],
                                 ekfMatrix.
                                 super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                 super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[7]));
      }
      if (gtest_ar__1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (gtest_ar__1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message(&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               ((long)&ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                       super_StandardBase<Kalman::Vector<float,_3>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c),(internal *)
                       ((long)&ekfMatrix.
                               super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),(AssertionResult *)"ekf.P.isIdentity()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/ExtendedKalmanFilter.cpp"
               ,0xe,(char *)CONCAT44(ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[8],
                                     ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[7]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    if ((float *)CONCAT44(ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                          super_StandardBase<Kalman::Vector<float,_3>_>.P.
                          super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[8],
                          ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                          super_StandardBase<Kalman::Vector<float,_3>_>.P.
                          super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[7]) !=
        (float *)((long)ekfMatrix.super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                        .array + 8U)) {
      operator_delete((undefined1 *)
                      CONCAT44(ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                               super_StandardBase<Kalman::Vector<float,_3>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data.array[8],
                               ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                               super_StandardBase<Kalman::Vector<float,_3>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data.array[7]));
    }
    if (CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(ExtendedKalmanFilter, init) {
    ExtendedKalmanFilter<Vector<T, 3>> ekf;
    ASSERT_TRUE(ekf.P.isIdentity()); // P should be identity

    // Same as above, but with general matrix type instead of vector
    ExtendedKalmanFilter<Matrix<T, 3, 1>> ekfMatrix;
    ASSERT_TRUE(ekfMatrix.P.isIdentity()); // P should be identity
}